

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

void __thiscall
hrgls::Message::Message(Message *this,string *value,timeval time,hrgls_MessageLevel level)

{
  hrgls_Status hVar1;
  int iVar2;
  hrgls_Message in_RAX;
  Message_private *pMVar3;
  hrgls_Message obj;
  hrgls_Message local_38;
  
  this->m_private = (Message_private *)0x0;
  local_38 = in_RAX;
  pMVar3 = (Message_private *)operator_new(0x10);
  pMVar3->Message = (hrgls_Message)0x0;
  pMVar3->status = 0;
  this->m_private = pMVar3;
  hVar1 = hrgls_MessageCreate(&local_38);
  pMVar3 = this->m_private;
  pMVar3->status = hVar1;
  pMVar3->Message = local_38;
  iVar2 = hrgls_MessageSetValue(local_38,(value->_M_dataplus)._M_p);
  if (iVar2 != 0) {
    this->m_private->status = iVar2;
  }
  iVar2 = hrgls_MessageSetTimeStamp(this->m_private->Message,time.tv_sec,time.tv_usec);
  if (iVar2 != 0) {
    this->m_private->status = iVar2;
  }
  iVar2 = hrgls_MessageSetLevel(this->m_private->Message,level);
  if (iVar2 != 0) {
    this->m_private->status = iVar2;
  }
  return;
}

Assistant:

Message::Message(::std::string value, struct timeval time,
	  hrgls_MessageLevel level)
  {
    m_private = new Message_private;
    hrgls_Message obj;
    m_private->status = hrgls_MessageCreate(&obj);
    m_private->Message = obj;
  	hrgls_Status s = hrgls_STATUS_OKAY;
	  s = hrgls_MessageSetValue(m_private->Message, value.c_str());
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
	  s = hrgls_MessageSetTimeStamp(m_private->Message, time);
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
	  s = hrgls_MessageSetLevel(m_private->Message, level);
	  if (s != hrgls_STATUS_OKAY) {
		  m_private->status = s;
	  }
  }